

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  vector3 cutting_plane_normal;
  vector3 cutting_plane_normal_00;
  vector3 camera_position_vector;
  string in_file_name_00;
  string in_file_name_01;
  vector3 look_at;
  vector3 cutting_plane_normal_01;
  vector3 massive_center;
  vector3 massive_center_00;
  CuttingPlane cutting_plane;
  string in_file_name_02;
  undefined1 auVar1 [12];
  undefined1 auVar2 [24];
  size_type sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  undefined8 uVar13;
  ostream *poVar14;
  ostream *poVar15;
  undefined7 uVar17;
  undefined7 uVar18;
  ulong uVar16;
  undefined1 angle_specified;
  long in_RCX;
  undefined7 uVar19;
  undefined7 uVar20;
  undefined7 uVar21;
  string *psVar22;
  string *psVar23;
  undefined1 in_R8B;
  undefined7 in_register_00000081;
  undefined1 uVar24;
  undefined8 in_R9;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  undefined4 uVar25;
  string *this;
  undefined4 uVar26;
  undefined4 in_stack_fffffffffffff644;
  undefined4 in_stack_fffffffffffff64c;
  uint in_stack_fffffffffffff654;
  undefined4 in_stack_fffffffffffff65c;
  undefined4 in_stack_fffffffffffff664;
  undefined4 in_stack_fffffffffffff66c;
  undefined1 uVar27;
  undefined8 uStack_978;
  int layer_count;
  undefined4 uStack_96c;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  double dVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  byte bVar35;
  uint uVar36;
  undefined4 uVar37;
  double dVar38;
  double dVar39;
  double layer_before_and_00;
  vector3 *massive_center_01;
  int *layer_count_00;
  double local_8f8;
  double local_8f0;
  allocator<char> local_8e8 [32];
  double local_8c8;
  double dStack_8c0;
  double local_8b8;
  double dStack_8b0;
  vector3 local_8a8;
  double local_880;
  double layer_before_and;
  double layer_only;
  double transparency;
  double cutting_plane_distance;
  double nozzle_width;
  double camera_angle;
  double local_848;
  double dStack_840;
  double local_838;
  double dStack_830;
  string in_file_name;
  vector3 local_808;
  vector3 local_7e8;
  vector3 local_7c8;
  vector3 local_7a8;
  double local_790;
  double local_788;
  double dStack_780;
  double local_778;
  double dStack_770;
  double local_768;
  undefined8 uStack_760;
  vector3 local_758;
  vector3 local_738;
  vector3 local_718;
  double local_6f8;
  double dStack_6f0;
  double local_6e8;
  vector3 local_6d8;
  vector3 local_6b8;
  vector3 local_698;
  istringstream ss;
  int iStack_670;
  undefined4 uStack_66c;
  double local_668;
  double dStack_660;
  double local_658;
  double dStack_650;
  double local_648;
  string local_4e8 [32];
  string local_4c8 [32];
  double local_4a8;
  undefined8 uStack_4a0;
  double local_498;
  double dStack_490;
  double local_488;
  double dStack_480;
  double local_478;
  double local_468;
  undefined8 uStack_460;
  double local_458;
  double dStack_450;
  double local_448;
  double dStack_440;
  double local_438;
  string local_428 [32];
  double local_408;
  double dStack_400;
  double local_3f8;
  vector3 local_3e8;
  string temp_string;
  fstream configure_file;
  byte abStack_220 [496];
  
  local_7a8.x = -100.0;
  local_7a8.y = -250.0;
  local_7a8.z = 220.0;
  local_7c8.x = -100.0;
  local_7c8.y = 100.0;
  local_7c8.z = 30.0;
  camera_angle = 60.0;
  nozzle_width = 0.4;
  local_7e8.x = 0.177;
  local_7e8.y = 0.472;
  local_7e8.z = 0.59;
  local_808.x = 0.177;
  local_808.y = 0.472;
  local_808.z = 0.59;
  cutting_plane_distance = 0.0;
  transparency = 0.0;
  layer_only = -1.0;
  layer_before_and = -1.0;
  in_file_name._M_dataplus._M_p = (pointer)&in_file_name.field_2;
  in_file_name._M_string_length = 0;
  in_file_name.field_2._M_local_buf[0] = '\0';
  std::operator<<((ostream *)&std::cout,"Reading configurations file...\n");
  std::fstream::fstream(&configure_file);
  std::fstream::open((char *)&configure_file,0x1087a0);
  if ((abStack_220[*(long *)(_configure_file + -0x18)] & 5) == 0) {
    temp_string._M_dataplus._M_p = (pointer)&temp_string.field_2;
    temp_string._M_string_length = 0;
    temp_string.field_2._M_local_buf[0] = '\0';
    std::operator<<((ostream *)&std::cout,"Parameters derived:\n");
    local_8f0 = 60.0;
    local_8f8 = 0.4;
    uVar36 = 0;
    uVar37 = 0;
    layer_before_and_00 = -1.0;
    massive_center_01 = (vector3 *)0xbff0000000000000;
    layer_count_00 = (int *)0x0;
    dVar32 = 0.0;
    bVar31 = 0;
    uVar21 = 0;
    bVar30 = 0;
    uVar20 = 0;
    uVar12 = 0;
    uVar26 = 0;
    bVar29 = 0;
    uVar19 = 0;
    bVar28 = 0;
    uVar17 = 0;
    local_848 = 0.0;
    bVar35 = 0;
    uVar18 = 0;
    while( true ) {
      uVar24 = (undefined1)in_R9;
      if ((abStack_220[*(long *)(_configure_file + -0x18)] & 2) != 0) break;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&configure_file,(string *)&temp_string);
      if ((*temp_string._M_dataplus._M_p != '#') || (temp_string._M_dataplus._M_p[1] != '#')) {
        iVar4 = std::__cxx11::string::find((char *)&temp_string,0x1087ef);
        iVar5 = std::__cxx11::string::find((char *)&temp_string,0x108802);
        iVar6 = std::__cxx11::string::find((char *)&temp_string,0x108813);
        iVar7 = std::__cxx11::string::find((char *)&temp_string,0x108827);
        local_8b8 = (double)std::__cxx11::string::find((char *)&temp_string,0x108833);
        uVar8 = std::__cxx11::string::find((char *)&temp_string,0x10883b);
        iVar9 = std::__cxx11::string::find((char *)&temp_string,0x108841);
        iVar10 = std::__cxx11::string::find((char *)&temp_string,0x10884f);
        local_838 = (double)std::__cxx11::string::find((char *)&temp_string,0x10885b);
        iVar11 = std::__cxx11::string::find((char *)&temp_string,0x10886d);
        local_8c8 = (double)std::__cxx11::string::find((char *)&temp_string,0x108883);
        uVar13 = std::__cxx11::string::find((char *)&temp_string,0x10889b);
        if (-1 < (int)uVar13) {
          uVar36 = (uint)CONCAT71((int7)((ulong)uVar13 >> 8),1);
          uVar37 = (undefined4)((ulong)uVar13 >> 0x20);
          std::operator<<((ostream *)&std::cout,"make_layer_video=yes\n");
        }
        if (-1 < iVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"camera_location=v(",local_8e8);
          VectorArgumentExtracterStream(&temp_string,iVar4 + iStack_670,&local_7a8);
          std::__cxx11::string::~string((string *)&ss);
          poVar14 = std::operator<<((ostream *)&std::cout,"camera_location=");
          poVar15 = operator<<(poVar14,&local_7a8);
          uVar12 = (uint)CONCAT71((int7)((ulong)poVar15 >> 8),1);
          uVar26 = (undefined4)((ulong)poVar15 >> 0x20);
          std::operator<<(poVar14,"\n");
        }
        if (-1 < iVar5) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"camera_lookat=v(",local_8e8);
          VectorArgumentExtracterStream(&temp_string,iVar5 + iStack_670,&local_7c8);
          std::__cxx11::string::~string((string *)&ss);
          poVar14 = std::operator<<((ostream *)&std::cout,"camera_lookat=");
          poVar15 = operator<<(poVar14,&local_7c8);
          uVar17 = (undefined7)((ulong)poVar15 >> 8);
          bVar28 = 1;
          std::operator<<(poVar14,"\n");
        }
        if (-1 < iVar6) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"filament_color=rgb(",local_8e8);
          VectorArgumentExtracterStream(&temp_string,iVar6 + iStack_670,&local_7e8);
          std::__cxx11::string::~string((string *)&ss);
          poVar14 = std::operator<<((ostream *)&std::cout,"filament_color=");
          operator<<(poVar14,&local_7e8);
          std::operator<<(poVar14,"\n");
        }
        if (-1 < iVar11) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"cutting_plane_normal=v(",local_8e8);
          VectorArgumentExtracterStream(&temp_string,iVar11 + iStack_670,&local_808);
          std::__cxx11::string::~string((string *)&ss);
          poVar14 = std::operator<<((ostream *)&std::cout,"cutting_plane_normal=");
          poVar15 = operator<<(poVar14,&local_808);
          uVar18 = (undefined7)((ulong)poVar15 >> 8);
          bVar35 = 1;
          std::operator<<(poVar14,"\n");
        }
        if (-1 < iVar7) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&ss,"view_angle=",local_8e8);
          ValueArgumentExtracterStream(&temp_string,iVar7 + iStack_670,&camera_angle);
          std::__cxx11::string::~string((string *)&ss);
          std::operator<<((ostream *)&std::cout,"view_angle=");
          local_8f0 = camera_angle;
          poVar14 = std::ostream::_M_insert<double>(camera_angle);
          uVar19 = (undefined7)((ulong)in_RCX >> 8);
          in_RCX = CONCAT71(uVar19,1);
          bVar29 = 1;
          std::operator<<(poVar14,"\n");
        }
        if (-1 < local_8b8._0_4_) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"nozzle_diameter=",local_8e8);
          ValueArgumentExtracterStream(&temp_string,SUB84(local_8b8,0) + iStack_670,&nozzle_width);
          std::__cxx11::string::~string((string *)&ss);
          std::operator<<((ostream *)&std::cout,"nozzle_diameter=");
          local_8f8 = nozzle_width;
          poVar14 = std::ostream::_M_insert<double>(nozzle_width);
          std::operator<<(poVar14,"\n");
        }
        if (-1 < iVar9) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"transparency=",local_8e8);
          ValueArgumentExtracterStream(&temp_string,iVar9 + iStack_670,&transparency);
          std::__cxx11::string::~string((string *)&ss);
          std::operator<<((ostream *)&std::cout,"transparency=");
          layer_count_00 = (int *)transparency;
          poVar14 = std::ostream::_M_insert<double>(transparency);
          std::operator<<(poVar14,"\n");
        }
        if (-1 < iVar10) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&ss,"layer_only=",local_8e8);
          ValueArgumentExtracterStream(&temp_string,iVar10 + iStack_670,&layer_only);
          std::__cxx11::string::~string((string *)&ss);
          massive_center_01 = (vector3 *)layer_only;
          if (0.0 <= layer_only) {
            std::operator<<((ostream *)&std::cout,"layer_only=");
            poVar14 = std::ostream::_M_insert<double>((double)massive_center_01);
            uVar20 = (undefined7)((ulong)in_RCX >> 8);
            in_RCX = CONCAT71(uVar20,1);
            bVar30 = 1;
            std::operator<<(poVar14,"\n");
          }
        }
        iVar4 = SUB84(local_838,0);
        if (-1 < iVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"layer_before_and=",local_8e8);
          ValueArgumentExtracterStream(&temp_string,iVar4 + iStack_670,&layer_before_and);
          std::__cxx11::string::~string((string *)&ss);
          layer_before_and_00 = layer_before_and;
          if (0.0 <= layer_before_and) {
            std::operator<<((ostream *)&std::cout,"layer_before_and=");
            poVar14 = std::ostream::_M_insert<double>(layer_before_and_00);
            uVar21 = (undefined7)((ulong)in_RCX >> 8);
            in_RCX = CONCAT71(uVar21,1);
            bVar31 = 1;
            std::operator<<(poVar14,"\n");
          }
        }
        if (-1 < local_8c8._0_4_) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"cutting_plane_distance=",local_8e8);
          ValueArgumentExtracterStream
                    (&temp_string,SUB84(local_8c8,0) + iStack_670,&cutting_plane_distance);
          std::__cxx11::string::~string((string *)&ss);
          std::operator<<((ostream *)&std::cout,"cutting_plane_distance=");
          dVar32 = cutting_plane_distance;
          poVar14 = std::ostream::_M_insert<double>(cutting_plane_distance);
          std::operator<<(poVar14,"\n");
        }
        if (-1 < (int)uVar8) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_8e8,"file=",(allocator<char> *)&layer_count);
          sVar3 = temp_string._M_string_length;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8a8,"file=",(allocator<char> *)((long)&uStack_96c + 3));
          in_RCX = sVar3 - ((ulong)(uVar8 & 0x7fffffff) + (long)local_8a8.y);
          std::__cxx11::string::substr((ulong)&ss,(ulong)&temp_string);
          std::__cxx11::string::operator=((string *)&in_file_name,(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::string::~string((string *)&local_8a8);
          std::__cxx11::string::~string((string *)local_8e8);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&ss,(string *)&in_file_name,_S_in);
          std::operator>>((istream *)&ss,(string *)&in_file_name);
          poVar14 = std::operator<<((ostream *)&std::cout,"file=");
          poVar14 = std::operator<<(poVar14,(string *)&in_file_name);
          std::operator<<(poVar14,"\n");
          uVar13 = std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
          local_848 = (double)CONCAT71((int7)((ulong)uVar13 >> 8),1);
        }
      }
    }
    if ((bVar35 & 1) != 0) {
      local_3e8.x._0_4_ = local_808.x._0_4_;
      local_3e8.x._4_4_ = local_808.x._4_4_;
      local_3e8.y._0_4_ = local_808.y._0_4_;
      local_3e8.y._4_4_ = local_808.y._4_4_;
      local_3e8.z = local_808.z;
      in_XMM1_Da = local_808.x._0_4_;
      in_XMM1_Db = local_808.x._4_4_;
      CuttingPlane::CuttingPlane((CuttingPlane *)&ss,&local_3e8,dVar32);
      uStack_760 = CONCAT44(uStack_66c,iStack_670);
      local_768 = _ss;
      local_778 = local_668;
      dStack_770 = dStack_660;
      local_788 = local_658;
      dStack_780 = dStack_650;
      local_880 = local_648;
    }
    angle_specified = (undefined1)in_RCX;
    std::__cxx11::string::~string((string *)&temp_string);
    local_8a8.z = 0.0;
    layer_count = 0;
    local_8a8.x = 0.0;
    local_8a8.y = 0.0;
    local_8b8 = local_7a8.x;
    dStack_8b0 = local_7a8.y;
    uVar33 = SUB84(local_7a8.z,0);
    uVar34 = (undefined4)((ulong)local_7a8.z >> 0x20);
    local_8c8 = local_7c8.x;
    dStack_8c0 = local_7c8.y;
    local_838 = local_7e8.x;
    dStack_830 = local_7e8.y;
    this = local_4c8;
    psVar22 = &in_file_name;
    uVar27 = 0xc1;
    psVar23 = this;
    dVar38 = local_7e8.z;
    dVar39 = local_7c8.z;
    dVar32 = (double)std::__cxx11::string::string(this,(string *)psVar22);
    uVar8 = local_848._0_1_ & 1;
    uVar16 = (ulong)uVar8;
    uVar25 = 0;
    camera_position_vector.y._0_4_ = uVar8;
    camera_position_vector.x = (double)this;
    camera_position_vector.y._4_4_ = in_stack_fffffffffffff644;
    camera_position_vector.z._0_4_ = 0;
    camera_position_vector.z._4_4_ = in_stack_fffffffffffff64c;
    auVar1._4_8_ = 0;
    auVar1._0_4_ = in_stack_fffffffffffff654;
    look_at.y._4_4_ = in_stack_fffffffffffff65c;
    look_at._0_12_ = auVar1 << 0x20;
    look_at.z._0_4_ = 0;
    look_at.z._4_4_ = in_stack_fffffffffffff664;
    auVar2._4_4_ = (int)&local_8a8;
    auVar2._0_4_ = in_stack_fffffffffffff66c;
    auVar2._8_4_ = (int)((ulong)&local_8a8 >> 0x20);
    auVar2._12_4_ = (int)&layer_count;
    auVar2._16_4_ = (int)((ulong)&layer_count >> 0x20);
    auVar2._20_4_ = 0;
    cutting_plane_normal_01.x._1_7_ = 0x1067;
    cutting_plane_normal_01.x._0_1_ = uVar27;
    cutting_plane_normal_01.y = (double)uStack_978;
    cutting_plane_normal_01.z._0_4_ = layer_count;
    cutting_plane_normal_01.z._4_4_ = uStack_96c;
    cutting_plane.normal.x._1_7_ = uVar17;
    cutting_plane.normal.x._0_1_ = bVar28;
    cutting_plane.normal.y._0_1_ = bVar29;
    cutting_plane.normal.y._1_7_ = uVar19;
    cutting_plane.normal.z._0_4_ = uVar12;
    cutting_plane.normal.z._4_4_ = uVar26;
    cutting_plane.start_distance._0_1_ = bVar30;
    cutting_plane.start_distance._1_7_ = uVar20;
    cutting_plane.uniform_normal.x._0_1_ = bVar31;
    cutting_plane.uniform_normal.x._1_7_ = uVar21;
    cutting_plane.uniform_normal.y._0_4_ = uVar8;
    cutting_plane.uniform_normal.y._4_4_ = 0;
    cutting_plane.uniform_normal.z._0_4_ = uVar33;
    cutting_plane.uniform_normal.z._4_4_ = uVar34;
    in_file_name_02._M_dataplus._M_p._1_7_ = uVar18;
    in_file_name_02._M_dataplus._M_p._0_1_ = bVar35;
    in_file_name_02._M_string_length._0_4_ = uVar36;
    in_file_name_02._M_string_length._4_4_ = uVar37;
    in_file_name_02.field_2._M_allocated_capacity = (size_type)dVar38;
    in_file_name_02.field_2._8_8_ = dVar39;
    GetMassiveCenter(camera_position_vector,look_at,dVar32,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da),
                     SUB81(psVar23,0),(vector3)(auVar2 << 0x20),cutting_plane_normal_01,
                     cutting_plane,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,in_file_name_02,
                     SUB81(psVar22,0),false,(bool)angle_specified,(bool)in_R8B,(bool)uVar24,
                     SUB81(layer_before_and_00,0),massive_center_01,layer_count_00);
    std::__cxx11::string::~string(local_4c8);
    poVar14 = std::operator<<((ostream *)&std::cout,"Layer count: ");
    iVar4 = layer_count;
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,layer_count);
    std::operator<<(poVar14,"\n");
    poVar14 = std::operator<<((ostream *)&std::cout,"Gcode Massive center: ");
    operator<<(poVar14,&local_8a8);
    std::operator<<(poVar14,"\n");
    std::operator<<((ostream *)&std::cout,"Move the hole print to the original point.\n");
    std::operator<<((ostream *)&std::cout,"Writing POV-Ray file...\n");
    if ((uVar36 & 1) == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      uVar37 = (undefined4)uVar16;
      std::__cxx11::string::find((char *)&in_file_name,0x108985);
      std::__cxx11::string::substr((ulong)&temp_string,(ulong)&in_file_name);
      std::operator<<((ostream *)&local_668,(string *)&temp_string);
      std::__cxx11::string::~string((string *)&temp_string);
      uVar26 = (undefined4)((ulong)this >> 0x20);
      local_718.x = local_8b8;
      local_718.y = dStack_8b0;
      local_718.z = (double)CONCAT44(uVar34,uVar33);
      local_738.x = local_8c8;
      local_738.y = dStack_8c0;
      local_758.x = local_838;
      local_758.y = dStack_830;
      local_4a8 = local_768;
      uStack_4a0 = uStack_760;
      local_498 = local_778;
      dStack_490 = dStack_770;
      local_488 = local_788;
      dStack_480 = dStack_780;
      local_478 = local_880;
      uVar24 = 0x7f;
      local_758.z = dVar38;
      local_738.z = dVar39;
      std::__cxx11::string::string(local_4e8,(string *)&in_file_name);
      local_408 = local_8a8.x;
      dStack_400 = local_8a8.y;
      local_3f8 = local_8a8.z;
      cutting_plane_normal_00.y._0_4_ = uVar37;
      cutting_plane_normal_00.x = (double)local_4e8;
      cutting_plane_normal_00.y._4_4_ = uVar25;
      cutting_plane_normal_00.z._0_4_ = bVar28 & 1;
      cutting_plane_normal_00.z._4_4_ = uVar26;
      in_file_name_01._M_string_length._0_4_ = uVar12 & 1;
      in_file_name_01._M_dataplus._M_p =
           (pointer)(CONCAT44(in_stack_fffffffffffff644,(uint)bVar29) & 0xffffffff00000001);
      in_file_name_01._M_string_length._4_4_ = in_stack_fffffffffffff64c;
      in_file_name_01.field_2._M_allocated_capacity._0_4_ = bVar30 & 1;
      in_file_name_01.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff654;
      in_file_name_01.field_2._8_4_ = bVar31 & 1;
      in_file_name_01.field_2._12_4_ = in_stack_fffffffffffff65c;
      massive_center_00.y._0_4_ = layer_count;
      massive_center_00.x = (double)uStack_978;
      massive_center_00.y._4_4_ = uStack_96c;
      massive_center_00.z._0_1_ = bVar28;
      massive_center_00.z._1_7_ = uVar17;
      Generate_single_file
                (&local_718,&local_738,local_8f0,local_8f8,(bool)(bVar35 & 1),&local_758,
                 cutting_plane_normal_00,(CuttingPlane *)CONCAT71(in_register_00000081,in_R8B),
                 in_XMM2_Qa,(double)layer_count_00,(double)massive_center_01,layer_before_and_00,
                 in_file_name_01,SUB81(&local_4a8,0),SUB81(&local_408,0),
                 SUB81((stringstream *)&ss,0),false,false,(bool)uVar24,massive_center_00,
                 (stringstream *)CONCAT71(uVar19,bVar29),uVar12,(bool)bVar30);
      std::__cxx11::string::~string(local_4e8);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::__cxx11::string::find((char *)&in_file_name,0x108985);
      std::__cxx11::string::substr((ulong)&temp_string,(ulong)&in_file_name);
      std::operator<<((ostream *)&local_668,(string *)&temp_string);
      std::__cxx11::string::~string((string *)&temp_string);
      local_848 = local_8a8.x;
      dStack_840 = local_8a8.y;
      local_790 = local_8a8.z;
      iVar5 = 0;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      bVar31 = bVar31 & 1;
      uVar20 = 0;
      bVar30 = bVar30 & 1;
      uVar19 = 0;
      uVar12 = uVar12 & 1;
      uVar26 = 0;
      bVar29 = bVar29 & 1;
      uVar18 = 0;
      bVar28 = bVar28 & 1;
      uVar17 = 0;
      for (; iVar4 != iVar5; iVar5 = iVar5 + 1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&temp_string);
        std::__cxx11::string::find((char *)&in_file_name,0x108985);
        std::__cxx11::string::substr((ulong)local_8e8,(ulong)&in_file_name);
        poVar14 = std::operator<<((ostream *)temp_string.field_2._M_local_buf,(string *)local_8e8);
        std::operator<<(poVar14,"\\");
        std::__cxx11::string::~string((string *)local_8e8);
        local_698.x = local_8b8;
        local_698.y = dStack_8b0;
        local_698.z = (double)CONCAT44(uVar34,uVar33);
        local_6b8.x = local_8c8;
        local_6b8.y = dStack_8c0;
        local_6d8.x = local_838;
        local_6d8.y = dStack_830;
        local_468 = local_768;
        uStack_460 = uStack_760;
        local_458 = local_778;
        dStack_450 = dStack_770;
        local_448 = local_788;
        dStack_440 = dStack_780;
        local_438 = local_880;
        uVar24 = 0xad;
        local_6d8.z = dVar38;
        local_6b8.z = dVar39;
        std::__cxx11::string::string(local_428,(string *)&in_file_name);
        local_6f8 = local_848;
        dStack_6f0 = dStack_840;
        local_6e8 = local_790;
        cutting_plane_normal.y._0_4_ = (int)uVar16;
        cutting_plane_normal.x = (double)local_428;
        cutting_plane_normal.y._4_4_ = (int)(uVar16 >> 0x20);
        cutting_plane_normal.z._0_4_ = (int)CONCAT71(uVar17,bVar28);
        cutting_plane_normal.z._4_4_ = (int)((uint7)uVar17 >> 0x18);
        in_file_name_00._M_dataplus._M_p._4_4_ = (int)((uint7)uVar18 >> 0x18);
        in_file_name_00._M_dataplus._M_p._0_4_ = (int)CONCAT71(uVar18,bVar29);
        in_file_name_00._M_string_length._0_4_ = uVar12;
        in_file_name_00._M_string_length._4_4_ = uVar26;
        in_file_name_00.field_2._M_allocated_capacity._0_4_ = (int)CONCAT71(uVar19,bVar30);
        in_file_name_00.field_2._M_allocated_capacity._4_4_ = (int)((uint7)uVar19 >> 0x18);
        in_file_name_00.field_2._8_4_ = (int)CONCAT71(uVar20,bVar31);
        in_file_name_00.field_2._12_4_ = (int)((uint7)uVar20 >> 0x18);
        massive_center.y._0_4_ = layer_count;
        massive_center.x = (double)uStack_978;
        massive_center.y._4_4_ = uStack_96c;
        massive_center.z._0_1_ = bVar28;
        massive_center.z._1_7_ = uVar17;
        Generate_single_file
                  (&local_698,&local_6b8,local_8f0,local_8f8,(bool)(bVar35 & 1),&local_6d8,
                   cutting_plane_normal,(CuttingPlane *)CONCAT71(in_register_00000081,in_R8B),
                   in_XMM2_Qa,(double)layer_count_00,(double)massive_center_01,layer_before_and_00,
                   in_file_name_00,SUB81(&local_468,0),SUB81(&local_6f8,0),SUB81(&temp_string,0),
                   SUB41(iVar5,0),true,(bool)uVar24,massive_center,
                   (stringstream *)CONCAT71(uVar18,bVar29),uVar12,(bool)bVar30);
        std::__cxx11::string::~string(local_428);
        std::__cxx11::stringstream::~stringstream((stringstream *)&temp_string);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::fstream::~fstream(&configure_file);
    std::__cxx11::string::~string((string *)&in_file_name);
    return 0;
  }
  poVar14 = std::operator<<((ostream *)&std::cout,"Configurations file not found.\n");
  std::operator<<(poVar14,"Exit.\n");
  exit(0);
}

Assistant:

int main(int argc, char* argv[])
{
  vector3 camera_position_vector(-100, -250, 220);
  vector3 look_at(-100, 100, 30);
  double camera_angle = 60;
  double nozzle_width = 0.4;
  bool has_cutting_plane = false;
  vector3 filament_color = vector3(0.3, 0.8, 1.0) * 0.59;
  vector3 cutting_plane_normal = vector3(0.3, 0.8, 1.0) * 0.59;
  CuttingPlane cutting_plane;
  double cutting_plane_distance = 0.0;
  double transparency = 0.0;
  double layer_only = -1;
  double layer_before_and = -1;
  string in_file_name;
  bool in_file_name_specified = false;
  bool look_at_specified = false;
  bool angle_specified = false;
  bool camera_position_specified = false;
  bool layer_only_specified = false;
  bool layer_before_and_specified = false;
  bool make_layer_video = false;

  // Read configurations file.
  cout << "Reading configurations file...\n";
  fstream configure_file;
  configure_file.open("configurations.txt");
  if (!configure_file)
  {
    cout << "Configurations file not found.\n" << "Exit.\n";
    exit(0);
  }
  else
  {
    string temp_string;
    cout << "Parameters derived:\n";

    while (!configure_file.eof())
    {
      getline(configure_file, temp_string);

      if (temp_string[0] == '#' && temp_string[1] == '#')
        continue;

      int camera_location_conf_pos = temp_string.find("camera_location=v(");
      int camera_lookat_conf_pos = temp_string.find("camera_lookat=v(");
      int filament_color_conf_pos = temp_string.find("filament_color=rgb(");
      int view_angle_conf_pos = temp_string.find("view_angle=");
      int nozzle_conf_pos = temp_string.find("nozzle=");
      int file_conf_pos = temp_string.find("file=");
      int transparency_conf_pos = temp_string.find("transparency=");
      int layer_only_pos = temp_string.find("layer_only=");
      int layer_before_and_pos = temp_string.find("layer_before_and=");
      int cutting_plane_normal_pos = temp_string.find("cutting_plane_normal=");
      int cutting_plane_distance_pos = temp_string.find("cutting_plane_distance=");
      int make_layer_video_pos = temp_string.find("make_layer_video");

      //////////////////////////////////////////////////////////////////////////
      // Boolean arguments.
      if (make_layer_video_pos >= 0)
      {
        make_layer_video = true;
        cout << "make_layer_video=yes\n";
      }

      //////////////////////////////////////////////////////////////////////////
      // Vector arguments.
      if (camera_location_conf_pos >= 0)
      {
        VectorArgumentExtracterStream(temp_string, camera_location_conf_pos + string("camera_location=v(").length(), camera_position_vector);
        camera_position_specified = true;
        cout << "camera_location=" << camera_position_vector << "\n";
      }

      if (camera_lookat_conf_pos >= 0)
      {
        VectorArgumentExtracterStream(temp_string, camera_lookat_conf_pos + string("camera_lookat=v(").length(), look_at);
        look_at_specified = true;
        cout << "camera_lookat=" << look_at << "\n";
      }

      if (filament_color_conf_pos >= 0)
      {
        VectorArgumentExtracterStream(temp_string, filament_color_conf_pos + string("filament_color=rgb(").length(), filament_color);
        cout << "filament_color=" << filament_color << "\n";
      }

      if (cutting_plane_normal_pos >= 0)
      {
        VectorArgumentExtracterStream(temp_string, cutting_plane_normal_pos + string("cutting_plane_normal=v(").length(), cutting_plane_normal);
        has_cutting_plane = true;
        cout << "cutting_plane_normal=" << cutting_plane_normal << "\n";
      }

      //////////////////////////////////////////////////////////////////////////
      // Value arguments.
      if (view_angle_conf_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, view_angle_conf_pos + string("view_angle=").length(), camera_angle);
        angle_specified = true;
        cout << "view_angle=" << camera_angle << "\n";
      }

      if (nozzle_conf_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, nozzle_conf_pos + string("nozzle_diameter=").length(), nozzle_width);
        cout << "nozzle_diameter=" << nozzle_width << "\n";
      }

      if (transparency_conf_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, transparency_conf_pos + string("transparency=").length(), transparency);
        cout << "transparency=" << transparency << "\n";
      }

      if (layer_only_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, layer_only_pos + string("layer_only=").length(), layer_only);
        if (layer_only >= 0)
        {
          layer_only_specified = true;
          cout << "layer_only=" << layer_only << "\n";
        }
      }

      if (layer_before_and_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, layer_before_and_pos + string("layer_before_and=").length(), layer_before_and);
        if (layer_before_and >= 0)
        {
          layer_before_and_specified = true;
          cout << "layer_before_and=" << layer_before_and << "\n";
        }
      }

      if (cutting_plane_distance_pos >= 0)
      {
        ValueArgumentExtracterStream(temp_string, cutting_plane_distance_pos + string("cutting_plane_distance=").length(), cutting_plane_distance);
        cout << "cutting_plane_distance=" << cutting_plane_distance << "\n";
      }

      //////////////////////////////////////////////////////////////////////////
      // String arguments.
      if (file_conf_pos >= 0)
      {
        in_file_name = temp_string.substr(file_conf_pos + string("file=").length(), temp_string.size() - file_conf_pos - string("file=").length());
        in_file_name_specified = true;
        istringstream ss(in_file_name);
        ss >> in_file_name;
        cout << "file=" << in_file_name << "\n";
      }
    }

    if (has_cutting_plane)
    {
      cutting_plane = CuttingPlane(cutting_plane_normal, cutting_plane_distance);
    }
  }

  // Compute the massive center.
  vector3 massive_center(0, 0, 0);
  int layer_count = 0;
  GetMassiveCenter(camera_position_vector, look_at, camera_angle, nozzle_width, has_cutting_plane,
    filament_color, cutting_plane_normal, cutting_plane, cutting_plane_distance,
    transparency, layer_only, layer_before_and, in_file_name, in_file_name_specified,
    look_at_specified, angle_specified, camera_position_specified, layer_only_specified, layer_before_and_specified,
    massive_center, layer_count);

  cout << "Layer count: " <<layer_count << "\n";
  cout << "Gcode Massive center: " << massive_center << "\n";
  cout << "Move the hole print to the original point.\n";

  // Write to the POV-Ray file.
  cout << "Writing POV-Ray file...\n";
  if (make_layer_video)
  {
    stringstream temp;
    temp << in_file_name.substr(0, in_file_name.find(".gcode"));
    // _mkdir(temp.str().c_str());

    for (int layer_index = 0; layer_index < layer_count; layer_index++)
    {
      stringstream out_file_name;
      out_file_name << in_file_name.substr(0, in_file_name.find(".gcode")) << "\\";

      Generate_single_file(camera_position_vector, look_at, camera_angle, nozzle_width, has_cutting_plane,
        filament_color, cutting_plane_normal, cutting_plane, cutting_plane_distance,
        transparency, layer_only, layer_before_and, in_file_name, in_file_name_specified,
        look_at_specified, angle_specified, camera_position_specified, layer_only_specified, layer_before_and_specified,
        massive_center, out_file_name, layer_index, make_layer_video);
    }
  }
  else
  {
    stringstream out_file_name;
    out_file_name << in_file_name.substr(0, in_file_name.find(".gcode"));
#ifdef _WIN32
    SYSTEMTIME sys;
    GetLocalTime(&sys);
    out_file_name << '_' << sys.wMonth << '_' << sys.wDay << '_' << sys.wHour << '_' << sys.wMinute;
#endif

    Generate_single_file(camera_position_vector, look_at, camera_angle, nozzle_width, has_cutting_plane,
      filament_color, cutting_plane_normal, cutting_plane, cutting_plane_distance,
      transparency, layer_only, layer_before_and, in_file_name, in_file_name_specified,
      look_at_specified, angle_specified, camera_position_specified, layer_only_specified, layer_before_and_specified,
      massive_center, out_file_name, 0, make_layer_video);
  }

  return 0;
}